

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O3

long __thiscall gl4cts::AdvancedUsageManyCounters::Run(AdvancedUsageManyCounters *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  GLuint *framebuffers;
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  undefined8 *data_00;
  long lVar4;
  GLuint *ebo;
  int i;
  uint attachment;
  long lVar5;
  bool in_stack_fffffffffffffe98;
  GLenum draw_buffers [8];
  GLuint data [64];
  
  GVar2 = gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
                    (&this->super_SACSubcaseBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
                     ,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(location = 0) out uvec4 o_color[8];\nuniform int u_active_counters[8];\nlayout(binding = 0) uniform atomic_uint ac_counter[8];\nvoid main() {\n  o_color[0] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[0]]));\n  o_color[1] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[1]]));\n  o_color[2] = uvec4(atomicCounter(ac_counter[u_active_counters[2]]));\n  o_color[3] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[3]]));\n  o_color[4] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[4]]));\n  o_color[5] = uvec4(atomicCounter(ac_counter[u_active_counters[5]]));\n  o_color[6] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[6]]));\n  o_color[7] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[7]]));\n}"
                     ,&DAT_00000001,in_stack_fffffffffffffe98);
  this->prog_ = GVar2;
  data_00 = (undefined8 *)operator_new(0x20);
  *data_00 = 0x3e8000003e8;
  data_00[1] = 0x3e8000003e8;
  data_00[2] = 0x3e8000003e8;
  data_00[3] = 0x3e8000003e8;
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  buffers = &this->counter_buffer_;
  glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*buffers);
  glu::CallLogWrapper::glBufferData(this_00,0x92c0,0x20,data_00,0x88ea);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  glu::CallLogWrapper::glGenTextures(this_00,8,this->rt_);
  lVar5 = 0xf;
  do {
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->rt_[lVar5 + -0xf]);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8236,8,8,0,0x8d94,0x1405,(void *)0x0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x17);
  framebuffers = &this->fbo_;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,framebuffers);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,*framebuffers);
  lVar5 = 0;
  do {
    ebo = (GLuint *)(ulong)this->rt_[lVar5];
    attachment = (uint)lVar5 | 0x8ce0;
    glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,attachment,this->rt_[lVar5],0);
    draw_buffers[lVar5] = attachment;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  glu::CallLogWrapper::glDrawBuffers(this_00,8,draw_buffers);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,0);
  gl4cts::anon_unknown_0::SACSubcaseBase::CreateTriangle
            (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,ebo);
  glu::CallLogWrapper::glUseProgram(this_00,this->prog_);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[0]");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,5);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[1]");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,2);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[2]");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,7);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[3]");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,3);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[4]");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,0);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[5]");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,4);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[6]");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,6);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->prog_,"u_active_counters[7]");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,1);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,*framebuffers);
  glu::CallLogWrapper::glViewport(this_00,0,0,8,8);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,*buffers);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->vao_);
  glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
  glu::CallLogWrapper::glReadBuffer(this_00,0x8ce0);
  GVar2 = 8;
  glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d94,0x1405,data);
  bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                    ((SACSubcaseBase *)0x40,(GLuint)data,(GLuint *)0x3e8,GVar2);
  lVar5 = -1;
  if (bVar1) {
    bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      (&this->super_SACSubcaseBase,this->counter_buffer_,0x14,0x428);
    if (bVar1) {
      glu::CallLogWrapper::glReadBuffer(this_00,0x8ce1);
      GVar2 = 8;
      glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d94,0x1405,data);
      bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                        ((SACSubcaseBase *)0x40,(GLuint)data,(GLuint *)0x3a8,GVar2);
      if (bVar1) {
        bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                          (&this->super_SACSubcaseBase,this->counter_buffer_,8,0x3a8);
        if (bVar1) {
          glu::CallLogWrapper::glReadBuffer(this_00,0x8ce2);
          glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d94,0x1405,data);
          lVar4 = 0;
          do {
            if (data[lVar4] != 1000) goto LAB_008ccbbf;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x40);
          bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                            (&this->super_SACSubcaseBase,this->counter_buffer_,0x1c,1000);
          if (bVar1) {
            glu::CallLogWrapper::glReadBuffer(this_00,0x8ce3);
            GVar2 = 8;
            glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d94,0x1405,data);
            bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                              ((SACSubcaseBase *)0x40,(GLuint)data,(GLuint *)0x3e8,GVar2);
            if (bVar1) {
              bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                                (&this->super_SACSubcaseBase,this->counter_buffer_,0xc,0x428);
              if (bVar1) {
                glu::CallLogWrapper::glReadBuffer(this_00,0x8ce4);
                GVar2 = 8;
                glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d94,0x1405,data);
                bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                                  ((SACSubcaseBase *)0x40,(GLuint)data,(GLuint *)0x3a8,GVar2);
                if (bVar1) {
                  bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                                    (&this->super_SACSubcaseBase,this->counter_buffer_,0,0x3a8);
                  if (bVar1) {
                    glu::CallLogWrapper::glReadBuffer(this_00,0x8ce5);
                    glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d94,0x1405,data);
                    lVar4 = 0;
                    do {
                      if (data[lVar4] != 1000) goto LAB_008ccbbf;
                      lVar4 = lVar4 + 1;
                    } while (lVar4 != 0x40);
                    bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                                      (&this->super_SACSubcaseBase,this->counter_buffer_,0x10,1000);
                    if (bVar1) {
                      glu::CallLogWrapper::glReadBuffer(this_00,0x8ce6);
                      GVar2 = 8;
                      glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d94,0x1405,data);
                      bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                                        ((SACSubcaseBase *)0x40,(GLuint)data,(GLuint *)0x3e8,GVar2);
                      if (bVar1) {
                        bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                                          (&this->super_SACSubcaseBase,this->counter_buffer_,0x18,
                                           0x428);
                        if (bVar1) {
                          glu::CallLogWrapper::glReadBuffer(this_00,0x8ce7);
                          GVar2 = 8;
                          glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d94,0x1405,data);
                          bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                                            ((SACSubcaseBase *)0x40,(GLuint)data,(GLuint *)0x3e8,
                                             GVar2);
                          if (bVar1) {
                            bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                                              (&this->super_SACSubcaseBase,this->counter_buffer_,4,
                                               0x428);
                            lVar5 = (ulong)bVar1 - 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_008ccbbf:
  operator_delete(data_00,0x20);
  return lVar5;
}

Assistant:

virtual long Run()
	{
		// create program
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_vertex;" NL "void main() {" NL
							 "  gl_Position = i_vertex;" NL "}";
		const char* src_fs =
			"#version 420 core" NL "layout(location = 0) out uvec4 o_color[8];" NL
			"uniform int u_active_counters[8];" NL "layout(binding = 0) uniform atomic_uint ac_counter[8];" NL
			"void main() {" NL "  o_color[0] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[0]]));" NL
			"  o_color[1] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[1]]));" NL
			"  o_color[2] = uvec4(atomicCounter(ac_counter[u_active_counters[2]]));" NL
			"  o_color[3] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[3]]));" NL
			"  o_color[4] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[4]]));" NL
			"  o_color[5] = uvec4(atomicCounter(ac_counter[u_active_counters[5]]));" NL
			"  o_color[6] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[6]]));" NL
			"  o_color[7] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[7]]));" NL "}";
		prog_ = CreateProgram(src_vs, NULL, NULL, NULL, src_fs, true);

		// create atomic counter buffer
		std::vector<GLuint> init_data(8, 1000);
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 32, &init_data[0], GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create render targets
		const int s = 8;
		glGenTextures(8, rt_);

		for (int i = 0; i < 8; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, rt_[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, s, s, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, NULL);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		// create fbo
		glGenFramebuffers(1, &fbo_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		GLenum draw_buffers[8];
		for (int i = 0; i < 8; ++i)
		{
			glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, rt_[i], 0);
			draw_buffers[i] = GL_COLOR_ATTACHMENT0 + i;
		};
		glDrawBuffers(8, draw_buffers);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		// create geometry
		CreateTriangle(&vao_, &vbo_, NULL);

		// set uniforms
		glUseProgram(prog_);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[0]"), 5);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[1]"), 2);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[2]"), 7);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[3]"), 3);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[4]"), 0);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[5]"), 4);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[6]"), 6);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[7]"), 1);

		// draw
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glViewport(0, 0, s, s);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glBindVertexArray(vao_);
		glDrawArrays(GL_TRIANGLES, 0, 3);

		// validate
		GLuint data[s * s];
		glReadBuffer(GL_COLOR_ATTACHMENT0);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 1000))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 20, 1064))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT1);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 1000 - 64))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 8, 1000 - 64))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT2);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		for (int i = 0; i < s * s; ++i)
			if (data[i] != 1000)
				return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 28, 1000))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT3);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 1000))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 12, 1064))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT4);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 1000 - 64))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 0, 1000 - 64))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT5);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		for (int i = 0; i < s * s; ++i)
			if (data[i] != 1000)
				return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 16, 1000))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT6);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 1000))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 24, 1064))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT7);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 1000))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 4, 1064))
			return ERROR;

		return NO_ERROR;
	}